

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O0

void __thiscall adios2::core::VariableBase::CheckDimensionsCommon(VariableBase *this,string *hint)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_01;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_02;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_03;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_04;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdf8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe10;
  allocator *paVar4;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  undefined1 uVar5;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  unsigned_long *local_118;
  unsigned_long *local_110;
  unsigned_long *local_108;
  unsigned_long *local_100;
  unsigned_long *local_f8;
  unsigned_long *local_f0;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  unsigned_long *local_40;
  unsigned_long *local_38;
  unsigned_long *local_30;
  unsigned_long *local_28;
  unsigned_long *local_20;
  unsigned_long *local_18;
  
  if (*(int *)(in_RDI + 2) != 4) {
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_fffffffffffffe10);
    if (bVar1) {
LAB_00965e50:
      bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (in_stack_fffffffffffffe10);
      if (!bVar1) {
        local_28 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             (in_stack_fffffffffffffdf8);
        local_30 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (in_stack_fffffffffffffdf8);
        __last_00._M_current._6_1_ = in_stack_fffffffffffffe1e;
        __last_00._M_current._0_6_ = in_stack_fffffffffffffe18;
        __last_00._M_current._7_1_ = in_stack_fffffffffffffe1f;
        dVar3 = std::
                count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (in_stack_fffffffffffffe20,__last_00,
                           (unsigned_long *)in_stack_fffffffffffffe10);
        bVar1 = true;
        if (0 < dVar3) goto LAB_00965f38;
      }
      bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        (in_stack_fffffffffffffe10);
      bVar1 = false;
      if (!bVar2) {
        local_38 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             (in_stack_fffffffffffffdf8);
        local_40 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (in_stack_fffffffffffffdf8);
        __last_01._M_current._6_1_ = in_stack_fffffffffffffe1e;
        __last_01._M_current._0_6_ = in_stack_fffffffffffffe18;
        __last_01._M_current._7_1_ = in_stack_fffffffffffffe1f;
        dVar3 = std::
                count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (in_stack_fffffffffffffe20,__last_01,
                           (unsigned_long *)in_stack_fffffffffffffe10);
        bVar1 = 0 < dVar3;
      }
    }
    else {
      local_18 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           (in_stack_fffffffffffffdf8);
      local_20 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (in_stack_fffffffffffffdf8);
      __last._M_current._6_1_ = in_stack_fffffffffffffe1e;
      __last._M_current._0_6_ = in_stack_fffffffffffffe18;
      __last._M_current._7_1_ = in_stack_fffffffffffffe1f;
      dVar3 = std::
              count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                        (in_stack_fffffffffffffe20,__last,(unsigned_long *)in_stack_fffffffffffffe10
                        );
      bVar1 = true;
      if (dVar3 < 1) goto LAB_00965e50;
    }
LAB_00965f38:
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Core",&local_61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"VariableBase",&local_99);
      in_stack_fffffffffffffe20._M_current = (unsigned_long *)&local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"CheckDimensionsCommon",(allocator *)in_stack_fffffffffffffe20._M_current)
      ;
      std::operator+((char *)in_RDI,in_RSI);
      helper::Throw<std::invalid_argument>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_RDI,(int)((ulong)in_RSI >> 0x20));
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_fffffffffffffe10);
  if (!bVar1) {
    local_f0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (in_stack_fffffffffffffdf8);
    local_f8 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffdf8);
    __last_02._M_current._6_1_ = in_stack_fffffffffffffe1e;
    __last_02._M_current._0_6_ = in_stack_fffffffffffffe18;
    __last_02._M_current._7_1_ = in_stack_fffffffffffffe1f;
    dVar3 = std::
            count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                      (in_stack_fffffffffffffe20,__last_02,
                       (unsigned_long *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe1f = true;
    if (1 < dVar3) goto LAB_0096629a;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_fffffffffffffe10);
  uVar5 = in_stack_fffffffffffffe1f;
  if (!bVar1) {
    local_100 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          (in_stack_fffffffffffffdf8);
    local_108 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          (in_stack_fffffffffffffdf8);
    __last_03._M_current._6_1_ = in_stack_fffffffffffffe1e;
    __last_03._M_current._0_6_ = in_stack_fffffffffffffe18;
    __last_03._M_current._7_1_ = in_stack_fffffffffffffe1f;
    dVar3 = std::
            count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                      (in_stack_fffffffffffffe20,__last_03,
                       (unsigned_long *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe1f = true;
    uVar5 = in_stack_fffffffffffffe1f;
    if (0 < dVar3) goto LAB_0096629a;
  }
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_fffffffffffffe10);
  in_stack_fffffffffffffe1f = false;
  if (!bVar1) {
    local_110 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          (in_stack_fffffffffffffdf8);
    local_118 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          (in_stack_fffffffffffffdf8);
    __last_04._M_current._6_1_ = in_stack_fffffffffffffe1f;
    __last_04._M_current._0_6_ = in_stack_fffffffffffffe18;
    __last_04._M_current._7_1_ = uVar5;
    dVar3 = std::
            count<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                      (in_stack_fffffffffffffe20,__last_04,
                       (unsigned_long *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe1f = 0 < dVar3;
  }
LAB_0096629a:
  if ((bool)in_stack_fffffffffffffe1f != false) {
    paVar4 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Core",paVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"VariableBase",&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"CheckDimensionsCommon",&local_189);
    std::operator+((char *)in_RDI,in_RSI);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_RDI,
               (int)((ulong)in_RSI >> 0x20));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  return;
}

Assistant:

void VariableBase::CheckDimensionsCommon(const std::string hint) const
{
    if (m_ShapeID != ShapeID::LocalValue)
    {
        if ((!m_Shape.empty() && std::count(m_Shape.begin(), m_Shape.end(), LocalValueDim) > 0) ||
            (!m_Start.empty() && std::count(m_Start.begin(), m_Start.end(), LocalValueDim) > 0) ||
            (!m_Count.empty() && std::count(m_Count.begin(), m_Count.end(), LocalValueDim) > 0))
        {
            helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckDimensionsCommon",
                                                 "LocalValueDim parameter is only "
                                                 "allowed as {LocalValueDim} in Shape dimensions " +
                                                     hint);
        }
    }

    if ((!m_Shape.empty() && std::count(m_Shape.begin(), m_Shape.end(), JoinedDim) > 1) ||
        (!m_Start.empty() && std::count(m_Start.begin(), m_Start.end(), JoinedDim) > 0) ||
        (!m_Count.empty() && std::count(m_Count.begin(), m_Count.end(), JoinedDim) > 0))
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckDimensionsCommon",
                                             "JoinedDim is only allowed once in "
                                             "Shape and cannot appear in start/count, " +
                                                 hint);
    }
}